

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationThresholdedReLU::SerializeWithCachedSizes
          (ActivationThresholdedReLU *this,CodedOutputStream *output)

{
  float fVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ActivationThresholdedReLU *this_local;
  
  fVar1 = alpha(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = alpha(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  return;
}

Assistant:

void ActivationThresholdedReLU::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ActivationThresholdedReLU)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 1;
  if (this->alpha() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->alpha(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ActivationThresholdedReLU)
}